

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O3

void SandStep(Gamefield *gamefield,IntVec2 coords)

{
  uint uVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  IntVec2 local_28;
  IntVec2 local_20;
  
  uVar4 = coords.x;
  local_28.y = coords.y + 1;
  local_20 = coords;
  if ((((-1 < (int)(local_28.y | uVar4)) && (uVar4 < gamefield->width)) &&
      ((uint)local_28.y < gamefield->height)) &&
     (local_28.x = uVar4, _Var2 = CheckDensity(gamefield,&local_20,&local_28), _Var2)) {
    return;
  }
  local_28.y = coords.y - 1;
  if ((((int)(local_28.y | uVar4) < 0) || (gamefield->width <= uVar4)) ||
     ((gamefield->height <= (uint)local_28.y ||
      (local_28.x = uVar4,
      gamefield->pixels[gamefield->width * local_28.y + uVar4].pixelType != Empty)))) {
    uVar3 = uVar4 - 1;
    if ((-1 < (int)(local_28.y | uVar3)) && (uVar1 = gamefield->width, uVar3 < uVar1)) {
      if ((uint)local_28.y < gamefield->height) {
        if (((gamefield->pixels[uVar1 * local_28.y + uVar3].pixelType == Empty) &&
            (local_28.x = uVar4 + 1, (uint)local_28.x < uVar1 && -1 < (local_28.y | local_28.x))) &&
           (gamefield->pixels[uVar1 * local_28.y + local_28.x].pixelType == Empty)) {
          if ((gamefield->simulationStep & 1) == 0) {
            local_28.x = uVar3;
          }
          goto LAB_0013f260;
        }
      }
      if (((uint)local_28.y < gamefield->height) &&
         (local_28.x = uVar3, gamefield->pixels[uVar1 * local_28.y + uVar3].pixelType == Empty))
      goto LAB_0013f260;
    }
    local_28.x = uVar4 + 1;
    if ((local_28.y | local_28.x) < 0) {
      return;
    }
    if (gamefield->width <= (uint)local_28.x) {
      return;
    }
    if (gamefield->height <= (uint)local_28.y) {
      return;
    }
    if (gamefield->pixels[gamefield->width * local_28.y + local_28.x].pixelType != Empty) {
      return;
    }
  }
LAB_0013f260:
  SwapSandPixel(gamefield,&local_20,&local_28);
  return;
}

Assistant:

void SandStep(Gamefield* gamefield, IntVec2 coords) {
    struct IntVec2 new;
    new.x = coords.x;
    new.y = coords.y + 1;
    if (WithinBounds(gamefield, coords.x, coords.y + 1) && CheckDensity(gamefield, &coords, &new)) {
        return;
    }

    if (WithinBounds(gamefield, coords.x, coords.y - 1) && gamefield->pixels[(coords.y - 1) * gamefield->width + coords.x].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        SwapSandPixel(gamefield, &coords, &new);
    }
        // check whether we can go either direction, that is done to simulate random behavior for particles
    else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
             gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty &&
             WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
             gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.y -= 1;
            new.x -= 1;
        } else {
            new.y -= 1;
            new.x += 1;
        }
        SwapSandPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x -= 1;
        SwapSandPixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y - 1) &&
               gamefield->pixels[(coords.y - 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y -= 1;
        new.x += 1;
        SwapSandPixel(gamefield, &coords, &new);
    }
}